

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O0

base_learner * cb_explore_setup(options_i *options,vw *all)

{
  wclass *pwVar1;
  vw *pvVar2;
  byte bVar3;
  typed_option<unsigned_long> *length;
  pointer pcVar4;
  single_learner *psVar5;
  wclass **ppwVar6;
  ulong uVar7;
  vw *in_RSI;
  learner<char,_example> *in_RDI;
  learner<CB_EXPLORE::cb_explore,_example> *l;
  single_learner *base;
  stringstream ss;
  uint32_t num_actions;
  option_group_definition new_options;
  free_ptr<CB_EXPLORE::cb_explore> data;
  typed_option<float> *in_stack_fffffffffffff0d8;
  prediction_type_t pred_type;
  vw *in_stack_fffffffffffff0e0;
  string *in_stack_fffffffffffff0e8;
  undefined7 in_stack_fffffffffffff0f0;
  byte in_stack_fffffffffffff0f7;
  learner<char,_example> *in_stack_fffffffffffff0f8;
  allocator *in_stack_fffffffffffff100;
  typed_option<float> *in_stack_fffffffffffff128;
  learner<char,_example> *plVar8;
  option_group_definition *in_stack_fffffffffffff130;
  allocator *paVar9;
  v_array<COST_SENSITIVE::wclass> *this;
  allocator local_ce1;
  string local_ce0 [39];
  allocator local_cb9;
  string local_cb8 [32];
  uint *local_c98;
  uint *puStack_c90;
  uint *local_c88;
  size_t sStack_c80;
  float *local_c78;
  float *pfStack_c70;
  float *local_c68;
  size_t sStack_c60;
  allocator local_c51;
  string local_c50 [32];
  vw *local_c30;
  single_learner *local_c28;
  string local_c20 [39];
  allocator local_bf9;
  string local_bf8 [32];
  stringstream local_bd8 [16];
  undefined1 local_bc8 [383];
  allocator local_a49;
  string local_a48 [36];
  uint32_t local_a24;
  undefined4 local_a20;
  allocator local_a19;
  string local_a18 [39];
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [32];
  typed_option<float> local_9a8 [2];
  allocator local_861;
  string local_860 [39];
  allocator local_839;
  string local_838 [32];
  typed_option<unsigned_long> local_818 [2];
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  typed_option<unsigned_long> local_688 [2];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [32];
  typed_option<float> local_4f8 [2];
  undefined1 local_3b1 [40];
  allocator local_389;
  string local_388 [32];
  typed_option<unsigned_long> local_368 [2];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [32];
  typed_option<unsigned_int> local_1d8 [2];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [72];
  vw *local_18;
  learner<char,_example> *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<CB_EXPLORE::cb_explore>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Contextual Bandit Exploration",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0e0,
             (string *)in_stack_fffffffffffff0d8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"cb_explore",&local_1f9);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x359388);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff0e8,(uint *)in_stack_fffffffffffff0e0)
  ;
  VW::config::typed_option<unsigned_int>::keep(local_1d8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,"Online explore-exploit for a <k> action contextual bandit problem",
             &local_221);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff0e0,
             (string *)in_stack_fffffffffffff0d8);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff0e0,
             (typed_option<unsigned_int> *)in_stack_fffffffffffff0d8);
  VW::config::option_group_definition::add<unsigned_int>
            (in_stack_fffffffffffff130,(typed_option<unsigned_int> *)in_stack_fffffffffffff128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_388,"first",&local_389);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35948a);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff0e8,(unsigned_long *)in_stack_fffffffffffff0e0);
  VW::config::typed_option<unsigned_long>::keep(local_368,true);
  this = (v_array<COST_SENSITIVE::wclass> *)local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_3b1 + 1),"tau-first exploration",(allocator *)this);
  length = VW::config::typed_option<unsigned_long>::help
                     ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0,
                      (string *)in_stack_fffffffffffff0d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff0d8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff130,(typed_option<unsigned_long> *)in_stack_fffffffffffff128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"epsilon",&local_519);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35958f);
  VW::config::make_option<float>(in_stack_fffffffffffff0e8,(float *)in_stack_fffffffffffff0e0);
  VW::config::typed_option<float>::keep(local_4f8,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffff0f7,in_stack_fffffffffffff0f0),
             (float)((ulong)in_stack_fffffffffffff0e8 >> 0x20));
  paVar9 = &local_541;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_540,"epsilon-greedy exploration",paVar9);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff0e0,(string *)in_stack_fffffffffffff0d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"bag",&local_6a9);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x3596b3);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff0e8,(unsigned_long *)in_stack_fffffffffffff0e0);
  VW::config::typed_option<unsigned_long>::keep(local_688,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6d0,"bagging-based exploration",&local_6d1);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0,
             (string *)in_stack_fffffffffffff0d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff0d8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff130,(typed_option<unsigned_long> *)in_stack_fffffffffffff128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"cover",&local_839);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x3597b8);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff0e8,(unsigned_long *)in_stack_fffffffffffff0e0);
  VW::config::typed_option<unsigned_long>::keep(local_818,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_860,"Online cover based exploration",&local_861);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0,
             (string *)in_stack_fffffffffffff0d8);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff0d8);
  VW::config::option_group_definition::add<unsigned_long>
            (in_stack_fffffffffffff130,(typed_option<unsigned_long> *)in_stack_fffffffffffff128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"psi",&local_9c9);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x3598bd);
  VW::config::make_option<float>(in_stack_fffffffffffff0e8,(float *)in_stack_fffffffffffff0e0);
  VW::config::typed_option<float>::keep(local_9a8,true);
  VW::config::typed_option<float>::default_value
            ((typed_option<float> *)CONCAT17(in_stack_fffffffffffff0f7,in_stack_fffffffffffff0f0),
             (float)((ulong)in_stack_fffffffffffff0e8 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9f0,"disagreement parameter for cover",&local_9f1);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff0e0,(string *)in_stack_fffffffffffff0d8);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
  pred_type = (prediction_type_t)((ulong)in_stack_fffffffffffff0d8 >> 0x20);
  VW::config::option_group_definition::add<float>
            (in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_860);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_838);
  std::allocator<char>::~allocator((allocator<char> *)&local_839);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string((string *)(local_3b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3b1);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_388);
  std::allocator<char>::~allocator((allocator<char> *)&local_389);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff0e0);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  (*(code *)**(undefined8 **)local_10)(local_10,local_60);
  plVar8 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a18,"cb_explore",&local_a19);
  bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_a18);
  std::__cxx11::string::~string(local_a18);
  std::allocator<char>::~allocator((allocator<char> *)&local_a19);
  pvVar2 = local_18;
  if (((bVar3 ^ 0xff) & 1) == 0) {
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a261);
    pcVar4->all = pvVar2;
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a279);
    plVar8 = local_10;
    local_a24 = (pcVar4->cbcs).num_actions;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a48,"cb",&local_a49);
    bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_a48);
    std::__cxx11::string::~string(local_a48);
    std::allocator<char>::~allocator((allocator<char> *)&local_a49);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_bd8);
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a34e);
      std::ostream::operator<<(local_bc8,(pcVar4->cbcs).num_actions);
      plVar8 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_bf8,"cb",&local_bf9);
      std::__cxx11::stringstream::str();
      (**(code **)(*(long *)plVar8 + 0x28))(plVar8,local_bf8,local_c20);
      std::__cxx11::string::~string(local_c20);
      std::__cxx11::string::~string(local_bf8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bf9);
      std::__cxx11::stringstream::~stringstream(local_bd8);
    }
    local_18->delete_prediction = ACTION_SCORE::delete_action_scores;
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a511);
    (pcVar4->cbcs).cb_type = 0;
    setup_base((options_i *)in_stack_fffffffffffff0e8,in_stack_fffffffffffff0e0);
    local_c28 = LEARNER::as_singleline<char,char>((learner<char,_char> *)paVar9);
    psVar5 = local_18->scorer;
    pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                       ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a580);
    plVar8 = local_10;
    (pcVar4->cbcs).scorer = psVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c50,"cover",&local_c51);
    bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_c50);
    std::__cxx11::string::~string(local_c50);
    std::allocator<char>::~allocator((allocator<char> *)&local_c51);
    if ((bVar3 & 1) == 0) {
      paVar9 = &local_cb9;
      plVar8 = local_10;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cb8,"bag",paVar9);
      bVar3 = (**(code **)(*(long *)plVar8 + 8))(plVar8,local_cb8);
      std::__cxx11::string::~string(local_cb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
      if ((bVar3 & 1) == 0) {
        in_stack_fffffffffffff100 = &local_ce1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ce0,"first",in_stack_fffffffffffff100);
        in_stack_fffffffffffff0f7 = (**(code **)(*(long *)local_10 + 8))(local_10,local_ce0);
        std::__cxx11::string::~string(local_ce0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ce1);
        if ((in_stack_fffffffffffff0f7 & 1) == 0) {
          in_stack_fffffffffffff0e0 =
               (vw *)LEARNER::
                     init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                               ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff100,
                                local_10,(_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                          *)CONCAT17(in_stack_fffffffffffff0f7,
                                                     in_stack_fffffffffffff0f0),
                                (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr *)
                                in_stack_fffffffffffff0e8,(size_t)in_stack_fffffffffffff0e0,
                                pred_type);
          local_c30 = in_stack_fffffffffffff0e0;
        }
        else {
          local_c30 = (vw *)LEARNER::
                            init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                                      ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff100
                                       ,local_10,
                                       (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                        *)CONCAT17(in_stack_fffffffffffff0f7,
                                                   in_stack_fffffffffffff0f0),
                                       (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                        *)in_stack_fffffffffffff0e8,
                                       (size_t)in_stack_fffffffffffff0e0,pred_type);
        }
      }
      else {
        std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                  ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a920);
        local_c30 = (vw *)LEARNER::
                          init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                                    ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff100,
                                     in_stack_fffffffffffff0f8,
                                     (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                      *)CONCAT17(in_stack_fffffffffffff0f7,in_stack_fffffffffffff0f0
                                                ),
                                     (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                      *)in_stack_fffffffffffff0e8,(size_t)in_stack_fffffffffffff0e0,
                                     pred_type);
        local_10 = in_stack_fffffffffffff0f8;
      }
    }
    else {
      psVar5 = LEARNER::as_singleline<char,char>((learner<char,_char> *)paVar9);
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a64b);
      pcVar4->cs = (learner<CB_EXPLORE::cb_explore,_example> *)psVar5;
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a667);
      v_array<COST_SENSITIVE::wclass>::resize(this,(size_t)length);
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a68e);
      ppwVar6 = v_array<COST_SENSITIVE::wclass>::begin(&(pcVar4->second_cs_label).costs);
      pwVar1 = *ppwVar6;
      uVar7 = (ulong)local_a24;
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a6d5);
      ppwVar6 = v_array<COST_SENSITIVE::wclass>::end(&(pcVar4->second_cs_label).costs);
      *ppwVar6 = pwVar1 + uVar7;
      v_init<float>();
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a725);
      (pcVar4->cover_probs).end_array = local_c68;
      (pcVar4->cover_probs).erase_count = sStack_c60;
      (pcVar4->cover_probs)._begin = local_c78;
      (pcVar4->cover_probs)._end = pfStack_c70;
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a750);
      v_array<float>::resize((v_array<float> *)this,(size_t)length);
      v_init<unsigned_int>();
      pcVar4 = std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                         ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a788);
      (pcVar4->preds).end_array = local_c88;
      (pcVar4->preds).erase_count = sStack_c80;
      (pcVar4->preds)._begin = local_c98;
      (pcVar4->preds)._end = puStack_c90;
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a7aa);
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a7c0);
      v_array<unsigned_int>::resize((v_array<unsigned_int> *)this,(size_t)length);
      std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::operator->
                ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)0x35a7f5);
      local_c30 = (vw *)LEARNER::
                        init_learner<CB_EXPLORE::cb_explore,example,LEARNER::learner<char,example>>
                                  ((free_ptr<CB_EXPLORE::cb_explore> *)in_stack_fffffffffffff100,
                                   in_stack_fffffffffffff0f8,
                                   (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                    *)CONCAT17(in_stack_fffffffffffff0f7,in_stack_fffffffffffff0f0),
                                   (_func_void_cb_explore_ptr_learner<char,_example>_ptr_example_ptr
                                    *)in_stack_fffffffffffff0e8,(size_t)in_stack_fffffffffffff0e0,
                                   pred_type);
      local_10 = in_stack_fffffffffffff0f8;
    }
    LEARNER::learner<CB_EXPLORE::cb_explore,_example>::set_finish
              ((learner<CB_EXPLORE::cb_explore,_example> *)in_stack_fffffffffffff100,
               (_func_void_cb_explore_ptr *)local_10);
    LEARNER::learner<CB_EXPLORE::cb_explore,_example>::set_finish_example
              ((learner<CB_EXPLORE::cb_explore,_example> *)local_c30,CB_EXPLORE::finish_example);
    local_8 = LEARNER::make_base<CB_EXPLORE::cb_explore,example>
                        ((learner<CB_EXPLORE::cb_explore,_example> *)local_c30);
  }
  else {
    local_8 = (base_learner *)0x0;
  }
  local_a20 = 1;
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff0e0);
  std::unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<CB_EXPLORE::cb_explore,_void_(*)(void_*)> *)
             CONCAT17(in_stack_fffffffffffff0f7,in_stack_fffffffffffff0f0));
  return local_8;
}

Assistant:

base_learner* cb_explore_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore>();
  option_group_definition new_options("Contextual Bandit Exploration");
  new_options
      .add(make_option("cb_explore", data->cbcs.num_actions)
               .keep()
               .help("Online explore-exploit for a <k> action contextual bandit problem"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().default_value(0.05f).help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("cb_explore"))
    return nullptr;

  data->all = &all;
  uint32_t num_actions = data->cbcs.num_actions;

  if (!options.was_supplied("cb"))
  {
    stringstream ss;
    ss << data->cbcs.num_actions;
    options.insert("cb", ss.str());
  }

  all.delete_prediction = delete_action_scores;
  data->cbcs.cb_type = CB_TYPE_DR;

  single_learner* base = as_singleline(setup_base(options, all));
  data->cbcs.scorer = all.scorer;

  learner<cb_explore, example>* l;
  if (options.was_supplied("cover"))
  {
    data->cs = (learner<cb_explore, example>*)(as_singleline(all.cost_sensitive));
    data->second_cs_label.costs.resize(num_actions);
    data->second_cs_label.costs.end() = data->second_cs_label.costs.begin() + num_actions;
    data->cover_probs = v_init<float>();
    data->cover_probs.resize(num_actions);
    data->preds = v_init<uint32_t>();
    data->preds.resize(data->cover_size);
    l = &init_learner(data, base, predict_or_learn_cover<true>, predict_or_learn_cover<false>, data->cover_size + 1,
        prediction_type::action_probs);
  }
  else if (options.was_supplied("bag"))
    l = &init_learner(data, base, predict_or_learn_bag<true>, predict_or_learn_bag<false>, data->bag_size,
        prediction_type::action_probs);
  else if (options.was_supplied("first"))
    l = &init_learner(
        data, base, predict_or_learn_first<true>, predict_or_learn_first<false>, 1, prediction_type::action_probs);
  else  // greedy
    l = &init_learner(
        data, base, predict_or_learn_greedy<true>, predict_or_learn_greedy<false>, 1, prediction_type::action_probs);

  l->set_finish(finish);
  l->set_finish_example(finish_example);
  return make_base(*l);
}